

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O2

void __thiscall Kumu::FileReader::~FileReader(FileReader *this)

{
  Result_t local_70;
  
  (this->super_IFileReader)._vptr_IFileReader = (_func_int **)&PTR__FileReader_001249b0;
  Close(&local_70,this);
  Result_t::~Result_t(&local_70);
  std::__cxx11::string::~string((string *)&this->m_Filename);
  return;
}

Assistant:

Kumu::FileReader::~FileReader()
{
  Kumu::FileReader::Close();
}